

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2lax_polygon_shape.cc
# Opt level: O0

void __thiscall S2LaxPolygonShape::Encode(S2LaxPolygonShape *this,Encoder *encoder,CodingHint hint)

{
  uint *ptr;
  int iVar1;
  pointer ptr_00;
  Encoder *encoder_00;
  Encoder *in_R8;
  Span<const_Vector3<double>_> points;
  Span<const_unsigned_int> v;
  Span<unsigned_int> local_60;
  s2coding *local_50;
  pointer local_48;
  Span<Vector3<double>_> local_40;
  s2coding *local_30;
  undefined8 local_28;
  CodingHint local_19;
  Encoder *pEStack_18;
  CodingHint hint_local;
  Encoder *encoder_local;
  S2LaxPolygonShape *this_local;
  
  local_19 = hint;
  pEStack_18 = encoder;
  encoder_local = (Encoder *)this;
  Encoder::Ensure(encoder,6);
  Encoder::put8(pEStack_18,'\x01');
  Encoder::put_varint32(pEStack_18,*(uint32 *)&(this->super_S2Shape).field_0xc);
  ptr_00 = std::unique_ptr<Vector3<double>[],_std::default_delete<Vector3<double>[]>_>::get
                     (&this->vertices_);
  iVar1 = num_vertices(this);
  local_40 = absl::MakeSpan<Vector3<double>_>(ptr_00,(long)iVar1);
  absl::Span<Vector3<double>const>::
  Span<absl::Span<Vector3<double>>,void,absl::Span<Vector3<double>>>
            ((Span<Vector3<double>const> *)&local_30,&local_40);
  points.len_._0_1_ = local_19;
  points.ptr_ = (pointer)local_28;
  points.len_._1_7_ = 0;
  encoder_00 = pEStack_18;
  s2coding::EncodeS2PointVector(local_30,points,(CodingHint)pEStack_18,in_R8);
  iVar1 = num_loops(this);
  if (1 < iVar1) {
    ptr = (this->field_2).cumulative_vertices_;
    iVar1 = num_loops(this);
    local_60 = absl::MakeSpan<unsigned_int>(ptr,(long)(iVar1 + 1));
    absl::Span<unsigned_int_const>::Span<absl::Span<unsigned_int>,void,absl::Span<unsigned_int>>
              ((Span<unsigned_int_const> *)&local_50,&local_60);
    v.len_ = (size_type)pEStack_18;
    v.ptr_ = local_48;
    s2coding::EncodeUintVector<unsigned_int>(local_50,v,encoder_00);
  }
  return;
}

Assistant:

void S2LaxPolygonShape::Encode(Encoder* encoder,
                               s2coding::CodingHint hint) const {
  encoder->Ensure(1 + Varint::kMax32);
  encoder->put8(kCurrentEncodingVersionNumber);
  encoder->put_varint32(num_loops_);
  s2coding::EncodeS2PointVector(MakeSpan(vertices_.get(), num_vertices()),
                                hint, encoder);
  if (num_loops() > 1) {
    s2coding::EncodeUintVector<uint32>(MakeSpan(cumulative_vertices_,
                                                num_loops() + 1), encoder);
  }
}